

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O1

void __thiscall
ProtoStoreInternal::restoreXml(ProtoStoreInternal *this,Element *el,ProtoModel *model)

{
  char cVar1;
  Architecture *pAVar2;
  Element *pEVar3;
  pointer ppEVar4;
  bool bVar5;
  pointer pPVar6;
  int iVar7;
  undefined4 extraout_var;
  Datatype *pDVar8;
  undefined4 extraout_var_00;
  long *plVar9;
  undefined4 extraout_var_02;
  LowlevelError *this_00;
  uint uVar10;
  Datatype **__args;
  bool __x;
  uint uVar11;
  long lVar12;
  undefined8 unaff_RBP;
  undefined7 uVar14;
  ulong uVar13;
  bool __x_00;
  pointer pbVar15;
  long lVar17;
  pointer ppEVar18;
  ProtoStoreInternal *pPVar19;
  string name;
  vector<ParameterPieces,_std::allocator<ParameterPieces>_> pieces;
  vector<bool,_std::allocator<bool>_> typelocklist;
  vector<bool,_std::allocator<bool>_> namelocklist;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  namelist;
  ulong local_138;
  undefined1 local_128 [32];
  vector<ParameterPieces,_std::allocator<ParameterPieces>_> local_108;
  vector<bool,_std::allocator<bool>_> local_f0;
  vector<bool,_std::allocator<bool>_> local_c8;
  ProtoStoreInternal *local_a0;
  uint local_94;
  Element *local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  ProtoModel *local_68;
  Architecture *local_60;
  ParameterPieces local_58;
  undefined4 extraout_var_01;
  char *pcVar16;
  
  local_90 = el;
  iVar7 = std::__cxx11::string::compare((char *)el);
  if (iVar7 != 0) {
    this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
    local_f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p =
         (_Bit_type *)
         &local_f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,
               "Mismatched ProtoStore tag: ProtoStoreInternal did not get <internallist>","");
    LowlevelError::LowlevelError(this_00,(string *)&local_f0);
    __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
  }
  pAVar2 = model->glb;
  local_108.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (ulong *)0x0;
  local_f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_128._16_8_ = (Datatype *)0x0;
  local_128._24_8_ = 0;
  local_128._0_8_ = (AddrSpace *)0x0;
  local_128._8_8_ = (Datatype **)0x0;
  std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::emplace_back<ParameterPieces>
            (&local_108,(ParameterPieces *)local_128);
  local_128._0_8_ = (AddrSpace *)(local_128 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"ret","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
  if ((AddrSpace *)local_128._0_8_ != (AddrSpace *)(local_128 + 0x10)) {
    operator_delete((void *)local_128._0_8_);
  }
  iVar7 = (*this->outparam->_vptr_ProtoParameter[6])();
  std::vector<bool,_std::allocator<bool>_>::push_back(&local_f0,SUB41(iVar7,0));
  std::vector<bool,_std::allocator<bool>_>::push_back(&local_c8,false);
  iVar7 = (*this->outparam->_vptr_ProtoParameter[3])();
  local_108.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
  super__Vector_impl_data._M_finish[-1].type = (Datatype *)CONCAT44(extraout_var,iVar7);
  local_108.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
  super__Vector_impl_data._M_finish[-1].flags = 0;
  iVar7 = (*this->outparam->_vptr_ProtoParameter[9])();
  if ((char)iVar7 != '\0') {
    local_108.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
    super__Vector_impl_data._M_finish[-1].flags =
         local_108.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
         super__Vector_impl_data._M_finish[-1].flags | 0x10000000;
  }
  local_a0 = this;
  (*this->outparam->_vptr_ProtoParameter[4])(local_128);
  uVar14 = (undefined7)((ulong)unaff_RBP >> 8);
  uVar13 = CONCAT71(uVar14,(AddrSpace *)local_128._0_8_ != (AddrSpace *)0x0);
  ppEVar18 = (local_90->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppEVar18 !=
      (local_90->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar13 = CONCAT71(uVar14,(AddrSpace *)local_128._0_8_ != (AddrSpace *)0x0);
    local_68 = model;
    local_60 = pAVar2;
    do {
      local_128._0_8_ = local_128 + 0x10;
      local_94 = (uint)uVar13;
      pEVar3 = *ppEVar18;
      local_128._8_8_ = (Datatype **)0x0;
      local_128._16_8_ = local_128._16_8_ & 0xffffffffffffff00;
      pbVar15 = (pEVar3->attr).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((int)((ulong)((long)(pEVar3->attr).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar15) >> 5) < 1)
      {
        __x_00 = false;
        __x = false;
        uVar11 = 0;
      }
      else {
        lVar17 = 0;
        lVar12 = 0;
        uVar11 = 0;
        __x = false;
        __x_00 = false;
        do {
          pcVar16 = (char *)((long)&(pbVar15->_M_dataplus)._M_p + lVar17);
          iVar7 = std::__cxx11::string::compare(pcVar16);
          if (iVar7 == 0) {
            std::__cxx11::string::_M_assign((string *)local_128);
          }
          else {
            iVar7 = std::__cxx11::string::compare(pcVar16);
            if (iVar7 == 0) {
              pbVar15 = (pEVar3->value).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((*(long *)((long)&pbVar15->_M_string_length + lVar17) == 0) ||
                 (((cVar1 = **(char **)((long)&(pbVar15->_M_dataplus)._M_p + lVar17), cVar1 != '1'
                   && (cVar1 != 't')) && (cVar1 != 'y')))) {
                __x_00 = false;
              }
              else {
                __x_00 = true;
              }
            }
            else {
              iVar7 = std::__cxx11::string::compare(pcVar16);
              if (iVar7 == 0) {
                pbVar15 = (pEVar3->value).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (*(long *)((long)&pbVar15->_M_string_length + lVar17) != 0) {
                  cVar1 = **(char **)((long)&(pbVar15->_M_dataplus)._M_p + lVar17);
                  __x = true;
                  if (((cVar1 == '1') || (cVar1 == 't')) || (cVar1 == 'y')) goto LAB_0025c341;
                }
                __x = false;
              }
              else {
                iVar7 = std::__cxx11::string::compare(pcVar16);
                if (iVar7 == 0) {
                  pbVar15 = (pEVar3->value).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  if (*(long *)((long)&pbVar15->_M_string_length + lVar17) == 0) {
LAB_0025c330:
                    bVar5 = false;
                  }
                  else {
                    cVar1 = **(char **)((long)&(pbVar15->_M_dataplus)._M_p + lVar17);
                    bVar5 = true;
                    if (((cVar1 != '1') && (cVar1 != 't')) && (cVar1 != 'y')) goto LAB_0025c330;
                  }
                  uVar10 = uVar11 | 0x10000000;
                }
                else {
                  iVar7 = std::__cxx11::string::compare(pcVar16);
                  if (iVar7 != 0) goto LAB_0025c341;
                  pbVar15 = (pEVar3->value).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  if (*(long *)((long)&pbVar15->_M_string_length + lVar17) == 0) {
LAB_0025c282:
                    bVar5 = false;
                  }
                  else {
                    cVar1 = **(char **)((long)&(pbVar15->_M_dataplus)._M_p + lVar17);
                    bVar5 = true;
                    if (((cVar1 != '1') && (cVar1 != 't')) && (cVar1 != 'y')) goto LAB_0025c282;
                  }
                  uVar10 = uVar11 | 0x20000000;
                }
                if (bVar5) {
                  uVar11 = uVar10;
                }
              }
            }
          }
LAB_0025c341:
          lVar12 = lVar12 + 1;
          pbVar15 = (pEVar3->attr).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar17 = lVar17 + 0x20;
        } while (lVar12 < (int)((ulong)((long)(pEVar3->attr).
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pbVar15) >> 5));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_88,(value_type *)local_128);
      std::vector<bool,_std::allocator<bool>_>::push_back(&local_f0,__x_00);
      std::vector<bool,_std::allocator<bool>_>::push_back(&local_c8,__x);
      local_58.type = (Datatype *)0x0;
      local_58.flags = 0;
      local_58._28_4_ = 0;
      local_58.addr.base = (AddrSpace *)0x0;
      local_58.addr.offset = 0;
      std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::emplace_back<ParameterPieces>
                (&local_108,&local_58);
      pAVar2 = local_60;
      pPVar6 = local_108.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      ppEVar4 = (pEVar3->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl
                .super__Vector_impl_data._M_start;
      Address::restoreXml(&local_58.addr,*ppEVar4,&local_60->super_AddrSpaceManager);
      pPVar6[-1].addr.base = local_58.addr.base;
      pPVar6[-1].addr.offset = local_58.addr.offset;
      pDVar8 = TypeFactory::restoreXmlType(pAVar2->types,ppEVar4[1]);
      pPVar6[-1].type = pDVar8;
      pPVar6[-1].flags = uVar11;
      uVar11 = local_94 & 0xff;
      if (pPVar6[-1].addr.base == (AddrSpace *)0x0) {
        uVar11 = 0;
      }
      uVar13 = (ulong)uVar11;
      std::vector<bool,_std::allocator<bool>_>::push_back(&local_f0,__x_00);
      std::vector<bool,_std::allocator<bool>_>::push_back(&local_c8,__x);
      if ((AddrSpace *)local_128._0_8_ != (AddrSpace *)(local_128 + 0x10)) {
        operator_delete((void *)local_128._0_8_);
      }
      ppEVar18 = ppEVar18 + 1;
      model = local_68;
    } while (ppEVar18 !=
             (local_90->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  pPVar19 = local_a0;
  if ((uVar13 & 1) == 0) {
    local_128._0_8_ = (AddrSpace *)0x0;
    local_128._8_8_ = (Datatype **)0x0;
    local_128._16_8_ = (Datatype *)0x0;
    if (local_108.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_108.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
        super__Vector_impl_data._M_start) {
      lVar12 = 0x10;
      uVar13 = 0;
      do {
        __args = (Datatype **)
                 ((long)&((local_108.
                           super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>.
                           _M_impl.super__Vector_impl_data._M_start)->addr).base + lVar12);
        if (local_128._8_8_ == local_128._16_8_) {
          std::vector<Datatype*,std::allocator<Datatype*>>::_M_realloc_insert<Datatype*const&>
                    ((vector<Datatype*,std::allocator<Datatype*>> *)local_128,
                     (iterator)local_128._8_8_,__args);
        }
        else {
          *(Datatype **)local_128._8_8_ = *__args;
          local_128._8_8_ = local_128._8_8_ + 8;
        }
        uVar13 = uVar13 + 1;
        lVar12 = lVar12 + 0x20;
      } while (uVar13 < (ulong)((long)local_108.
                                      super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_108.
                                      super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    if (local_108.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_108.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_108.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_108.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    ProtoModel::assignParameterStorage
              (model,(vector<Datatype_*,_std::allocator<Datatype_*>_> *)local_128,&local_108,true);
    pPVar19 = local_a0;
    if (((local_108.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
          super__Vector_impl_data._M_start)->addr).base == (AddrSpace *)0x0) {
      *local_f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
       .super__Bit_iterator_base._M_p =
           *local_f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p & 0xfffffffffffffffe;
    }
    iVar7 = (*(local_a0->super_ProtoStore)._vptr_ProtoStore[7])(local_a0);
    (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar7) + 0x60))
              ((long *)CONCAT44(extraout_var_00,iVar7),
               (uint)*local_f0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p & 1);
    if ((AddrSpace *)local_128._0_8_ != (AddrSpace *)0x0) {
      operator_delete((void *)local_128._0_8_);
    }
  }
  if (0x20 < (ulong)((long)local_108.
                           super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_108.
                          super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>.
                          _M_impl.super__Vector_impl_data._M_start)) {
    local_138 = 1;
    uVar13 = 1;
    uVar11 = 2;
    do {
      if ((local_108.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
           super__Vector_impl_data._M_start[uVar13].flags & 0x20000000) == 0) {
        iVar7 = (*(pPVar19->super_ProtoStore)._vptr_ProtoStore[2])
                          (pPVar19,(ulong)(uVar11 - 2),
                           local_88.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + local_138,
                           local_108.
                           super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>.
                           _M_impl.super__Vector_impl_data._M_start + uVar13);
        plVar9 = (long *)CONCAT44(extraout_var_01,iVar7);
        (**(code **)(*plVar9 + 0x60))
                  (plVar9,(*(ulong *)((long)local_f0.super__Bvector_base<std::allocator<bool>_>.
                                            _M_impl.super__Bvector_impl_data._M_start.
                                            super__Bit_iterator_base._M_p +
                                     (ulong)((uint)local_138 >> 6) * 8) >> (local_138 & 0x3f) & 1)
                          != 0);
        (**(code **)(*plVar9 + 0x68))
                  (plVar9,(local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                           [(uint)local_138 >> 6] & 1L << ((byte)local_138 & 0x3f)) != 0);
        local_138 = (ulong)((uint)local_138 + 1);
        pPVar19 = local_a0;
      }
      else {
        local_128._0_8_ = (AddrSpace *)(local_128 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"rethidden","");
        iVar7 = (*(pPVar19->super_ProtoStore)._vptr_ProtoStore[2])
                          (pPVar19,(ulong)(uVar11 - 2),(string *)local_128,
                           local_108.
                           super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>.
                           _M_impl.super__Vector_impl_data._M_start + uVar13);
        if ((AddrSpace *)local_128._0_8_ != (AddrSpace *)(local_128 + 0x10)) {
          operator_delete((void *)local_128._0_8_);
        }
        (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar7) + 0x60))
                  ((long *)CONCAT44(extraout_var_02,iVar7),
                   (uint)*local_f0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p & 1);
      }
      uVar13 = (ulong)uVar11;
      uVar11 = uVar11 + 1;
    } while (uVar13 < (ulong)((long)local_108.
                                    super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_108.
                                    super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  if (local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (ulong *)0x0) {
    operator_delete(local_f0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (ulong *)0x0;
    local_f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_108.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ProtoStoreInternal::restoreXml(const Element *el,ProtoModel *model)

{
  if (el->getName() != "internallist")
    throw LowlevelError("Mismatched ProtoStore tag: ProtoStoreInternal did not get <internallist>");
  Architecture *glb = model->getArch();
  const List &list(el->getChildren());
  List::const_iterator iter;
  vector<ParameterPieces> pieces;
  vector<string> namelist;
  vector<bool> typelocklist;
  vector<bool> namelocklist;
  bool addressesdetermined = true;

  pieces.push_back( ParameterPieces() ); // Push on placeholder for output pieces
  namelist.push_back("ret");
  typelocklist.push_back(outparam->isTypeLocked());
  namelocklist.push_back(false);
  pieces.back().type = outparam->getType();
  pieces.back().flags = 0;
  if (outparam->isIndirectStorage())
    pieces.back().flags |= Varnode::indirectstorage;
  if (outparam->getAddress().isInvalid())
    addressesdetermined = false;

  for(iter=list.begin();iter!=list.end();++iter) { // This is only the input params
    const Element *subel = *iter;
    string name;
    bool typelock = false;
    bool namelock = false;
    uint4 flags = 0;
    for(int4 i=0;i<subel->getNumAttributes();++i) {
      const string &attr( subel->getAttributeName(i) );
      if (attr == "name")
	name = subel->getAttributeValue(i);
      else if (attr == "typelock")
	typelock = xml_readbool(subel->getAttributeValue(i));
      else if (attr == "namelock")
	namelock = xml_readbool(subel->getAttributeValue(i));
      else if (attr == "indirectstorage") {
	if (xml_readbool(subel->getAttributeValue(i)))
	  flags |= Varnode::indirectstorage;
      }
      else if (attr == "hiddenretparm") {
	if (xml_readbool(subel->getAttributeValue(i)))
	  flags |= Varnode::hiddenretparm;
      }
    }
    namelist.push_back(name);
    typelocklist.push_back(typelock);
    namelocklist.push_back(namelock);
    pieces.push_back(ParameterPieces());
    ParameterPieces &curparam( pieces.back() );
    const List &sublist(subel->getChildren());
    List::const_iterator subiter;
    subiter = sublist.begin();
    curparam.addr = Address::restoreXml(*subiter,glb);
    ++subiter;
    curparam.type = glb->types->restoreXmlType(*subiter);
    curparam.flags = flags;
    if (curparam.addr.isInvalid())
      addressesdetermined = false;
    typelocklist.push_back(typelock);
    namelocklist.push_back(namelock);
  }
  ProtoParameter *curparam;
  if (!addressesdetermined) {
    // If addresses for parameters are not provided, use
    // the model to derive them from type info
    vector<Datatype *> typelist;
    for(int4 i=0;i<pieces.size();++i) // Save off the restored types
      typelist.push_back( pieces[i].type );
    pieces.clear();		// throw out any other piece information
    model->assignParameterStorage(typelist,pieces,true);
    if (pieces[0].addr.isInvalid()) {	// If could not get valid storage for output
      typelocklist[0] = false;		// Treat as unlocked void
    }
    curparam = setOutput(pieces[0]);
    curparam->setTypeLock(typelocklist[0]);
  }
  uint4 j=1;
  for(uint4 i=1;i<pieces.size();++i) {
    if ((pieces[i].flags&Varnode::hiddenretparm)!=0) {
       curparam = setInput(i-1,"rethidden",pieces[i]);
       curparam->setTypeLock(typelocklist[0]);   // Has output's typelock
       continue;    // increment i but not j
    }
    curparam = setInput(i-1,namelist[j],pieces[i]);
    curparam->setTypeLock(typelocklist[j]);
    curparam->setNameLock(namelocklist[j]);
    j = j + 1;
  }
}